

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O1

void __thiscall QTextHtmlExporter::emitBlockAttributes(QTextHtmlExporter *this,QTextBlock *block)

{
  long lVar1;
  qreal qVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  LayoutDirection LVar7;
  PageBreakFlags policy;
  char *pcVar8;
  QChar QVar9;
  long in_FS_OFFSET;
  QLatin1String QVar10;
  QLatin1String QVar11;
  QLatin1String QVar12;
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QBrush bg;
  QString local_c8;
  QString local_b0;
  QString local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat((QTextBlock *)local_78);
  iVar6 = QTextFormat::intProperty((QTextFormat *)local_78,0x1010);
  emitAlignment(this,(Alignment)(iVar6 + (uint)(iVar6 == 0)));
  LVar7 = QTextBlock::textDirection(block);
  if (LVar7 == RightToLeft) {
    QVar10.m_data = (char *)0xa;
    QVar10.m_size = (qsizetype)this;
    QString::append(QVar10);
  }
  QVar11.m_data = (char *)0x8;
  QVar11.m_size = (qsizetype)this;
  QString::append(QVar11);
  QTextBlock::begin((iterator *)local_68,block);
  uVar3 = local_68._12_4_;
  uVar4 = local_68._16_4_;
  if (local_68._16_4_ == local_68._12_4_) {
    QVar12.m_data = (char *)0x19;
    QVar12.m_size = (qsizetype)this;
    QString::append(QVar12);
  }
  qVar2 = QTextFormat::doubleProperty((QTextFormat *)local_78,0x1030);
  QString::number(qVar2,(char)(QString *)local_68,0x67);
  qVar2 = QTextFormat::doubleProperty((QTextFormat *)local_78,0x1031);
  QString::number(qVar2,(char)&local_98,0x67);
  qVar2 = QTextFormat::doubleProperty((QTextFormat *)local_78,0x1032);
  QString::number(qVar2,(char)&local_b0,0x67);
  qVar2 = QTextFormat::doubleProperty((QTextFormat *)local_78,0x1033);
  QString::number(qVar2,(char)&local_c8,0x67);
  emitMargins(this,(QString *)local_68,&local_98,&local_b0,&local_c8);
  if ((QTextFormatPrivate *)local_c8.d.d != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_c8.d.d = *(int *)local_c8.d.d + -1;
    UNLOCK();
    if (*(int *)local_c8.d.d == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QTextFormatPrivate *)local_b0.d.d != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_b0.d.d = *(int *)local_b0.d.d + -1;
    UNLOCK();
    if (*(int *)local_b0.d.d == 0) {
      QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QTextFormatPrivate *)local_98.d.d != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_98.d.d = *(int *)local_98.d.d + -1;
    UNLOCK();
    if (*(int *)local_98.d.d == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QTextFormatPrivate *)local_68._0_8_ != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_68._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  QVar13.m_data = (char *)0x12;
  QVar13.m_size = (qsizetype)this;
  QString::append(QVar13);
  iVar6 = QTextFormat::intProperty((QTextFormat *)local_78,0x1040);
  QString::number((int)local_68,iVar6);
  QString::append(&this->html);
  if ((QTextFormatPrivate *)local_68._0_8_ != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_68._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  QVar9.ucs = (char16_t)this;
  QString::append(QVar9);
  QVar14.m_data = (char *)0xd;
  QVar14.m_size = (qsizetype)this;
  QString::append(QVar14);
  qVar2 = QTextFormat::doubleProperty((QTextFormat *)local_78,0x1034);
  QString::number(qVar2,(char)local_68,0x67);
  QString::append(&this->html);
  if ((QTextFormatPrivate *)local_68._0_8_ != (QTextFormatPrivate *)0x0) {
    LOCK();
    *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_68._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
    }
  }
  QVar15.m_data = (char *)0x3;
  QVar15.m_size = (qsizetype)this;
  QString::append(QVar15);
  iVar6 = QTextBlock::userState(block);
  if (iVar6 != -1) {
    QVar16.m_data = (char *)0x10;
    QVar16.m_size = (qsizetype)this;
    QString::append(QVar16);
    iVar6 = QTextBlock::userState(block);
    QString::number((int)local_68,iVar6);
    QString::append(&this->html);
    if ((QTextFormatPrivate *)local_68._0_8_ != (QTextFormatPrivate *)0x0) {
      LOCK();
      *(int *)local_68._0_8_ = *(int *)local_68._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_68._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_68._0_8_,2,0x10);
      }
    }
    QString::append(QVar9);
  }
  iVar6 = QTextFormat::intProperty((QTextFormat *)local_78,0x1049);
  if (iVar6 != 0) {
    qVar2 = QTextFormat::doubleProperty((QTextFormat *)local_78,0x1048);
    QString::number(qVar2,(char)&local_98,0x67);
    local_48 = local_98.d.size;
    pcStack_50 = local_98.d.ptr;
    local_68._16_8_ = local_98.d.d;
    local_68._0_8_ = (QTextFormatPrivate *)0xd;
    local_68._8_8_ = " line-height:";
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = (char16_t *)0x0;
    local_98.d.size = 0;
    ::operator+=(&this->html,(QStringBuilder<QLatin1String,_QString> *)local_68);
    if ((QTextFormatPrivate *)local_68._16_8_ != (QTextFormatPrivate *)0x0) {
      LOCK();
      *(int *)local_68._16_8_ = *(int *)local_68._16_8_ + -1;
      UNLOCK();
      if (*(int *)local_68._16_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_68._16_8_,2,0x10);
      }
    }
    if ((QTextFormatPrivate *)local_98.d.d != (QTextFormatPrivate *)0x0) {
      LOCK();
      *(int *)local_98.d.d = *(int *)local_98.d.d + -1;
      UNLOCK();
      if (*(int *)local_98.d.d == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    iVar6 = QTextFormat::intProperty((QTextFormat *)local_78,0x1049);
    switch(iVar6) {
    case 1:
      pcVar8 = (char *)0x2;
      break;
    case 2:
      pcVar8 = (char *)0x1e;
      break;
    case 3:
      pcVar8 = (char *)0x3;
      break;
    case 4:
      pcVar8 = (char *)0x26;
      break;
    default:
      pcVar8 = (char *)0x1;
    }
    QVar17.m_data = pcVar8;
    QVar17.m_size = (qsizetype)this;
    QString::append(QVar17);
  }
  policy.super_QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>.
  super_QFlagsStorage<QTextFormat::PageBreakFlag>.i =
       (QFlagsStorageHelper<QTextFormat::PageBreakFlag,_4>)
       QTextFormat::intProperty((QTextFormat *)local_78,0x7000);
  emitPageBreakPolicy(this,policy);
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_98);
  if (uVar4 == uVar3) {
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::charFormat((QTextBlock *)local_68);
    formatDifference((QTextFormat *)&local_c8,&(this->defaultCharFormat).super_QTextFormat);
    QTextFormat::toCharFormat((QTextFormat *)&local_b0);
    QTextFormat::operator=((QTextFormat *)&local_98,(QTextFormat *)&local_b0);
    QTextFormat::~QTextFormat((QTextFormat *)&local_b0);
    QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
    QTextFormat::~QTextFormat((QTextFormat *)local_68);
  }
  QTextFormat::clearProperty((QTextFormat *)&local_98,0x820);
  bVar5 = QTextFormat::hasProperty((QTextFormat *)local_78,0x820);
  if (bVar5) {
    local_b0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::brushProperty((QTextFormat *)&local_b0,(int)local_78);
    if ((((ArrayOptions *)((long)local_b0.d.d + 4))->
        super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
        super_QFlagsStorage<QArrayData::ArrayOption>.i != 0) {
      QTextFormat::property((QVariant *)local_68,(QTextFormat *)local_78,0x820);
      QTextFormat::setProperty((QTextFormat *)&local_98,0x820,(QVariant *)local_68);
      ::QVariant::~QVariant((QVariant *)local_68);
    }
    QBrush::~QBrush((QBrush *)&local_b0);
  }
  QTextFormat::properties((QTextFormat *)local_68);
  if ((QTextFormatPrivate *)local_68._0_8_ == (QTextFormatPrivate *)0x0) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                *)local_68);
  }
  else {
    lVar1._0_4_ = ((QArrayData *)(local_68._0_8_ + 0x30))->ref_;
    lVar1._4_4_ = ((QArrayData *)(local_68._0_8_ + 0x30))->flags;
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                *)local_68);
    if (lVar1 != 0) {
      emitCharFormatStyle(this,(QTextCharFormat *)&local_98);
    }
  }
  QString::append(QVar9);
  QTextFormat::~QTextFormat((QTextFormat *)&local_98);
  QTextFormat::~QTextFormat((QTextFormat *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitBlockAttributes(const QTextBlock &block)
{
    QTextBlockFormat format = block.blockFormat();
    emitAlignment(format.alignment());

    // assume default to not bloat the html too much
    // html += " dir='ltr'"_L1;
    if (block.textDirection() == Qt::RightToLeft)
        html += " dir='rtl'"_L1;

    const auto style = " style=\""_L1;
    html += style;

    const bool emptyBlock = block.begin().atEnd();
    if (emptyBlock) {
        html += "-qt-paragraph-type:empty;"_L1;
    }

    emitMargins(QString::number(format.topMargin()),
                QString::number(format.bottomMargin()),
                QString::number(format.leftMargin()),
                QString::number(format.rightMargin()));

    html += " -qt-block-indent:"_L1;
    html += QString::number(format.indent());
    html += u';';

    html += " text-indent:"_L1;
    html += QString::number(format.textIndent());
    html += "px;"_L1;

    if (block.userState() != -1) {
        html += " -qt-user-state:"_L1;
        html += QString::number(block.userState());
        html += u';';
    }

    if (format.lineHeightType() != QTextBlockFormat::SingleHeight) {
        html += " line-height:"_L1
             + QString::number(format.lineHeight());
        switch (format.lineHeightType()) {
            case QTextBlockFormat::ProportionalHeight:
                html += "%;"_L1;
                break;
            case QTextBlockFormat::FixedHeight:
                html += "; -qt-line-height-type: fixed;"_L1;
                break;
            case QTextBlockFormat::MinimumHeight:
                html += "px;"_L1;
                break;
            case QTextBlockFormat::LineDistanceHeight:
                html += "; -qt-line-height-type: line-distance;"_L1;
                break;
            default:
                html += ";"_L1;
                break; // Should never reach here
        }
    }

    emitPageBreakPolicy(format.pageBreakPolicy());

    QTextCharFormat diff;
    if (emptyBlock) { // only print character properties when we don't expect them to be repeated by actual text in the parag
        const QTextCharFormat blockCharFmt = block.charFormat();
        diff = formatDifference(defaultCharFormat, blockCharFmt).toCharFormat();
    }

    diff.clearProperty(QTextFormat::BackgroundBrush);
    if (format.hasProperty(QTextFormat::BackgroundBrush)) {
        QBrush bg = format.background();
        if (bg.style() != Qt::NoBrush)
            diff.setProperty(QTextFormat::BackgroundBrush, format.property(QTextFormat::BackgroundBrush));
    }

    if (!diff.properties().isEmpty())
        emitCharFormatStyle(diff);

    html += u'"';

}